

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2CompareEqual(uint *p0,uint *p1,int nWords,int fCompl)

{
  int local_2c;
  int w;
  int fCompl_local;
  int nWords_local;
  uint *p1_local;
  uint *p0_local;
  
  if (fCompl == 0) {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      if (p0[local_2c] != p1[local_2c]) {
        return 0;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < nWords; local_2c = local_2c + 1) {
      if (p0[local_2c] != (p1[local_2c] ^ 0xffffffff)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Gia_Sim2CompareEqual( unsigned * p0, unsigned * p1, int nWords, int fCompl )
{
    int w;
    if ( !fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                return 0;
        return 1;
    }
}